

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool __thiscall kratos::PackedStruct::same(PackedStruct *this,PackedStruct *def)

{
  PackedStructFieldDef *this_00;
  PackedStructFieldDef *pPVar1;
  PackedStructFieldDef *def_00;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  this_00 = (this->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pPVar1 - (long)this_00;
  def_00 = (def->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 == (long)(def->attributes).
                     super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)def_00) {
    bVar7 = pPVar1 == this_00;
    if ((!bVar7) && (bVar2 = PackedStructFieldDef::same(this_00,def_00), bVar2)) {
      uVar4 = (lVar5 >> 4) * -0x5555555555555555;
      uVar3 = 1;
      do {
        uVar6 = (ulong)uVar3;
        bVar2 = uVar4 - uVar6 == 0;
        bVar7 = uVar4 < uVar6 || bVar2;
        if (uVar4 < uVar6 || bVar2) {
          return bVar7;
        }
        bVar2 = PackedStructFieldDef::same(this_00 + uVar6,def_00 + uVar6);
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool PackedStruct::same(const PackedStruct &def) const {
    if (attributes.size() != def.attributes.size()) return false;
    for (auto i = 0u; i < attributes.size(); i++) {
        if (!attributes[i].same(def.attributes[i])) return false;
    }
    return true;
}